

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# part.c
# Opt level: O2

exr_result_t
exr_get_tile_sizes(exr_const_context_t ctxt,int part_index,int levelx,int levely,int32_t *tilew,
                  int32_t *tileh)

{
  uint uVar1;
  long lVar2;
  uint *puVar3;
  exr_result_t eVar4;
  code *UNRECOVERED_JUMPTABLE;
  uint uVar5;
  undefined8 uVar6;
  
  if (ctxt == (exr_const_context_t)0x0) {
    return 2;
  }
  if ((part_index < 0) || (*(int *)(ctxt + 0xc4) <= part_index)) {
    eVar4 = (**(code **)(ctxt + 0x48))
                      (ctxt,4,"Part index (%d) out of range",(ulong)(uint)part_index,
                       *(code **)(ctxt + 0x48));
    return eVar4;
  }
  lVar2 = *(long *)(*(long *)(ctxt + 0x1d8) + (ulong)(uint)part_index * 8);
  if ((*(uint *)(lVar2 + 4) | 2) == 3) {
    if ((((*(long *)(lVar2 + 0x60) == 0) || (*(int *)(lVar2 + 0xc0) < 1)) ||
        (*(int *)(lVar2 + 0xc4) < 1)) ||
       ((*(long *)(lVar2 + 200) == 0 || (*(long *)(lVar2 + 0xd0) == 0)))) {
      eVar4 = (**(code **)(ctxt + 0x48))
                        (ctxt,0xd,"Tile data missing or corrupt",*(code **)(ctxt + 0x48));
      return eVar4;
    }
    if ((levelx < *(int *)(lVar2 + 0xc0) && -1 < (levely | levelx)) &&
        levely < *(int *)(lVar2 + 0xc4)) {
      puVar3 = *(uint **)(*(long *)(lVar2 + 0x60) + 0x18);
      if (tilew != (int32_t *)0x0) {
        uVar5 = *(uint *)(*(long *)(lVar2 + 0xd8) + (ulong)(uint)levelx * 4);
        uVar1 = *puVar3;
        if (uVar1 < uVar5) {
          uVar5 = uVar1;
        }
        *tilew = uVar5;
      }
      if (tileh == (int32_t *)0x0) {
        return 0;
      }
      uVar5 = *(uint *)(*(long *)(lVar2 + 0xe0) + (ulong)(uint)levely * 4);
      uVar1 = puVar3[1];
      if (uVar1 < uVar5) {
        uVar5 = uVar1;
      }
      *tileh = uVar5;
      return 0;
    }
    UNRECOVERED_JUMPTABLE = *(code **)(ctxt + 0x38);
    uVar6 = 4;
  }
  else {
    UNRECOVERED_JUMPTABLE = *(code **)(ctxt + 0x38);
    uVar6 = 0x13;
  }
  eVar4 = (*UNRECOVERED_JUMPTABLE)(ctxt,uVar6);
  return eVar4;
}

Assistant:

exr_result_t
exr_get_tile_sizes (
    exr_const_context_t ctxt,
    int                 part_index,
    int                 levelx,
    int                 levely,
    int32_t*            tilew,
    int32_t*            tileh)
{
    EXR_PROMOTE_CONST_CONTEXT_AND_PART_OR_ERROR (ctxt, part_index);

    if (part->storage_mode == EXR_STORAGE_TILED ||
        part->storage_mode == EXR_STORAGE_DEEP_TILED)
    {
        const exr_attr_tiledesc_t* tiledesc;

        if (!part->tiles || part->num_tile_levels_x <= 0 ||
            part->num_tile_levels_y <= 0 || !part->tile_level_tile_count_x ||
            !part->tile_level_tile_count_y)
        {
            return EXR_UNLOCK_WRITE_AND_RETURN_PCTXT (pctxt->print_error (
                pctxt,
                EXR_ERR_MISSING_REQ_ATTR,
                "Tile data missing or corrupt"));
        }

        if (levelx < 0 || levely < 0 || levelx >= part->num_tile_levels_x ||
            levely >= part->num_tile_levels_y)
            return EXR_UNLOCK_WRITE_AND_RETURN_PCTXT (
                pctxt->standard_error (pctxt, EXR_ERR_ARGUMENT_OUT_OF_RANGE));

        tiledesc = part->tiles->tiledesc;
        if (tilew)
        {
            int32_t levw = part->tile_level_tile_size_x[levelx];
            if (tiledesc->x_size < (uint32_t) levw)
                *tilew = (int32_t) tiledesc->x_size;
            else
                *tilew = levw;
        }
        if (tileh)
        {
            int32_t levh = part->tile_level_tile_size_y[levely];
            if (tiledesc->y_size < (uint32_t) levh)
                *tileh = (int32_t) tiledesc->y_size;
            else
                *tileh = levh;
        }
        return EXR_UNLOCK_WRITE_AND_RETURN_PCTXT (EXR_ERR_SUCCESS);
    }

    return EXR_UNLOCK_WRITE_AND_RETURN_PCTXT (
        pctxt->standard_error (pctxt, EXR_ERR_TILE_SCAN_MIXEDAPI));
}